

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O3

int cm_zlib_deflate(z_streamp_conflict strm,int flush)

{
  Bytef BVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  deflate_state *s;
  Bytef *pBVar5;
  Bytef *pBVar6;
  Bytef *pBVar7;
  Posf *__s;
  bool bVar8;
  Bytef BVar9;
  block_state bVar10;
  uLong uVar11;
  gz_headerp pgVar12;
  ulong uVar13;
  uint uVar14;
  int iVar15;
  uInt uVar16;
  ulong uVar17;
  uint uVar18;
  uInt uVar19;
  
  if (strm == (z_streamp_conflict)0x0) {
    return -2;
  }
  s = (deflate_state *)strm->state;
  if (4 < (uint)flush || s == (deflate_state *)0x0) {
    return -2;
  }
  if ((strm->next_out == (Bytef *)0x0) ||
     (((strm->next_in == (Bytef *)0x0 && (strm->avail_in != 0)) ||
      (iVar15 = s->status, flush != 4 && iVar15 == 0x29a)))) {
    strm->msg = "stream error";
    return -2;
  }
  if (strm->avail_out == 0) {
LAB_0052853f:
    strm->msg = "buffer error";
    iVar15 = -5;
  }
  else {
    s->strm = strm;
    iVar2 = s->last_flush;
    s->last_flush = flush;
    if (iVar15 == 0x2a) {
      if (s->wrap != 2) {
        uVar18 = s->w_bits * 0x1000 - 0x7800;
        uVar14 = 0;
        if ((s->strategy < 2) && (uVar4 = s->level, 1 < (int)uVar4)) {
          uVar14 = 0x40;
          if (5 < uVar4) {
            uVar14 = (uVar4 != 6 | 2) << 6;
          }
        }
        uVar4 = uVar14 + 0x20 + uVar18;
        if (s->strstart == 0) {
          uVar4 = uVar14 | uVar18;
        }
        s->status = 0x71;
        uVar18 = s->pending;
        s->pending = uVar18 + 1;
        s->pending_buf[uVar18] = (Bytef)(uVar4 >> 8);
        uVar18 = s->pending;
        s->pending = uVar18 + 1;
        s->pending_buf[uVar18] =
             (((char)(uVar4 / 0x1f) - (char)(uVar4 / 0x1f << 5)) + (byte)uVar4 | (byte)uVar4) ^ 0x1f
        ;
        if (s->strstart != 0) {
          BVar9 = *(Bytef *)((long)&strm->adler + 2);
          BVar1 = *(Bytef *)((long)&strm->adler + 3);
          uVar18 = s->pending;
          s->pending = uVar18 + 1;
          s->pending_buf[uVar18] = BVar1;
          uVar18 = s->pending;
          s->pending = uVar18 + 1;
          s->pending_buf[uVar18] = BVar9;
          uVar11 = strm->adler;
          uVar18 = s->pending;
          s->pending = uVar18 + 1;
          s->pending_buf[uVar18] = (Bytef)(uVar11 >> 8);
          uVar18 = s->pending;
          s->pending = uVar18 + 1;
          s->pending_buf[uVar18] = (Bytef)uVar11;
        }
        uVar11 = cm_zlib_adler32(0,(Bytef *)0x0,0);
        strm->adler = uVar11;
        iVar15 = s->status;
        goto LAB_0052819c;
      }
      uVar11 = cm_zlib_crc32(0,(uchar *)0x0,0);
      strm->adler = uVar11;
      uVar18 = s->pending;
      s->pending = uVar18 + 1;
      s->pending_buf[uVar18] = '\x1f';
      uVar18 = s->pending;
      s->pending = uVar18 + 1;
      s->pending_buf[uVar18] = 0x8b;
      uVar18 = s->pending;
      s->pending = uVar18 + 1;
      s->pending_buf[uVar18] = '\b';
      pgVar12 = s->gzhead;
      if (pgVar12 != (gz_headerp)0x0) {
        iVar15 = pgVar12->text;
        iVar3 = pgVar12->hcrc;
        pBVar5 = pgVar12->extra;
        pBVar6 = pgVar12->name;
        pBVar7 = pgVar12->comment;
        uVar18 = s->pending;
        s->pending = uVar18 + 1;
        s->pending_buf[uVar18] =
             (pBVar7 != (Bytef *)0x0) << 4 |
             (pBVar6 != (Bytef *)0x0) << 3 |
             (pBVar5 != (Bytef *)0x0) << 2 | (iVar3 != 0) * '\x02' | iVar15 != 0;
        uVar11 = s->gzhead->time;
        uVar18 = s->pending;
        s->pending = uVar18 + 1;
        s->pending_buf[uVar18] = (Bytef)uVar11;
        BVar9 = *(Bytef *)((long)&s->gzhead->time + 1);
        uVar18 = s->pending;
        s->pending = uVar18 + 1;
        s->pending_buf[uVar18] = BVar9;
        BVar9 = *(Bytef *)((long)&s->gzhead->time + 2);
        uVar18 = s->pending;
        s->pending = uVar18 + 1;
        s->pending_buf[uVar18] = BVar9;
        BVar9 = *(Bytef *)((long)&s->gzhead->time + 3);
        uVar18 = s->pending;
        s->pending = uVar18 + 1;
        s->pending_buf[uVar18] = BVar9;
        BVar9 = '\x02';
        if (s->level != 9) {
          BVar9 = (s->level < 2 || 1 < s->strategy) << 2;
        }
        uVar18 = s->pending;
        s->pending = uVar18 + 1;
        s->pending_buf[uVar18] = BVar9;
        iVar15 = s->gzhead->os;
        uVar18 = s->pending;
        s->pending = uVar18 + 1;
        s->pending_buf[uVar18] = (Bytef)iVar15;
        pgVar12 = s->gzhead;
        if (pgVar12->extra != (Bytef *)0x0) {
          uVar16 = pgVar12->extra_len;
          uVar18 = s->pending;
          s->pending = uVar18 + 1;
          s->pending_buf[uVar18] = (Bytef)uVar16;
          BVar9 = *(Bytef *)((long)&s->gzhead->extra_len + 1);
          uVar18 = s->pending;
          s->pending = uVar18 + 1;
          s->pending_buf[uVar18] = BVar9;
          pgVar12 = s->gzhead;
        }
        if (pgVar12->hcrc != 0) {
          uVar11 = cm_zlib_crc32(strm->adler,s->pending_buf,s->pending);
          strm->adler = uVar11;
        }
        s->gzindex = 0;
        s->status = 0x45;
        goto LAB_005281a5;
      }
      uVar18 = s->pending;
      s->pending = uVar18 + 1;
      s->pending_buf[uVar18] = '\0';
      uVar18 = s->pending;
      s->pending = uVar18 + 1;
      s->pending_buf[uVar18] = '\0';
      uVar18 = s->pending;
      s->pending = uVar18 + 1;
      s->pending_buf[uVar18] = '\0';
      uVar18 = s->pending;
      s->pending = uVar18 + 1;
      s->pending_buf[uVar18] = '\0';
      uVar18 = s->pending;
      s->pending = uVar18 + 1;
      s->pending_buf[uVar18] = '\0';
      BVar9 = '\x02';
      if (s->level != 9) {
        BVar9 = (s->level < 2 || 1 < s->strategy) << 2;
      }
      uVar18 = s->pending;
      s->pending = uVar18 + 1;
      s->pending_buf[uVar18] = BVar9;
      uVar18 = s->pending;
      s->pending = uVar18 + 1;
      s->pending_buf[uVar18] = '\x03';
LAB_005284fa:
      s->status = 0x71;
    }
    else {
LAB_0052819c:
      if (iVar15 == 0x45) {
LAB_005281a5:
        pgVar12 = s->gzhead;
        if (pgVar12->extra != (Bytef *)0x0) {
          uVar16 = s->pending;
          uVar19 = s->gzindex;
          while (uVar19 < (ushort)pgVar12->extra_len) {
            uVar18 = s->pending;
            uVar13 = (ulong)uVar18;
            if (s->pending_buf_size == uVar13) {
              if ((pgVar12->hcrc != 0) && (uVar16 <= uVar18 && uVar18 - uVar16 != 0)) {
                uVar11 = cm_zlib_crc32(strm->adler,s->pending_buf + uVar16,uVar18 - uVar16);
                strm->adler = uVar11;
              }
              flush_pending(strm);
              uVar16 = s->pending;
              uVar13 = (ulong)uVar16;
              pgVar12 = s->gzhead;
              if (s->pending_buf_size == uVar13) break;
              uVar19 = s->gzindex;
            }
            BVar9 = pgVar12->extra[uVar19];
            s->pending = (int)uVar13 + 1;
            s->pending_buf[uVar13] = BVar9;
            uVar19 = s->gzindex + 1;
            s->gzindex = uVar19;
            pgVar12 = s->gzhead;
          }
          if ((pgVar12->hcrc != 0) &&
             (uVar18 = s->pending - uVar16, uVar16 <= s->pending && uVar18 != 0)) {
            uVar11 = cm_zlib_crc32(strm->adler,s->pending_buf + uVar16,uVar18);
            strm->adler = uVar11;
            pgVar12 = s->gzhead;
          }
          if (s->gzindex != pgVar12->extra_len) {
            iVar15 = s->status;
            goto LAB_0052830a;
          }
          s->gzindex = 0;
        }
        s->status = 0x49;
LAB_00528317:
        if (pgVar12->name != (Bytef *)0x0) {
          uVar16 = s->pending;
          do {
            uVar18 = s->pending;
            uVar13 = (ulong)uVar18;
            pgVar12 = s->gzhead;
            if (s->pending_buf_size == uVar13) {
              if ((pgVar12->hcrc != 0) && (uVar16 <= uVar18 && uVar18 - uVar16 != 0)) {
                uVar11 = cm_zlib_crc32(strm->adler,s->pending_buf + uVar16,uVar18 - uVar16);
                strm->adler = uVar11;
              }
              flush_pending(strm);
              uVar16 = s->pending;
              uVar13 = (ulong)uVar16;
              if (s->pending_buf_size == uVar13) {
                bVar8 = false;
                goto LAB_00528392;
              }
              pgVar12 = s->gzhead;
            }
            pBVar5 = pgVar12->name;
            uVar18 = s->gzindex;
            s->gzindex = uVar18 + 1;
            BVar9 = pBVar5[uVar18];
            s->pending = (int)uVar13 + 1;
            s->pending_buf[uVar13] = BVar9;
          } while (BVar9 != '\0');
          bVar8 = true;
          uVar13 = (ulong)uVar16;
LAB_00528392:
          if ((s->gzhead->hcrc != 0) &&
             (uVar18 = s->pending - (uint)uVar13, (uint)uVar13 <= s->pending && uVar18 != 0)) {
            uVar11 = cm_zlib_crc32(strm->adler,s->pending_buf + uVar13,uVar18);
            strm->adler = uVar11;
          }
          if (!bVar8) {
            iVar15 = s->status;
            goto LAB_005283d0;
          }
          s->gzindex = 0;
        }
        s->status = 0x5b;
LAB_005283d9:
        if (s->gzhead->comment != (Bytef *)0x0) {
          uVar16 = s->pending;
          do {
            uVar18 = s->pending;
            uVar13 = (ulong)uVar18;
            pgVar12 = s->gzhead;
            if (s->pending_buf_size == uVar13) {
              if ((pgVar12->hcrc != 0) && (uVar16 <= uVar18 && uVar18 - uVar16 != 0)) {
                uVar11 = cm_zlib_crc32(strm->adler,s->pending_buf + uVar16,uVar18 - uVar16);
                strm->adler = uVar11;
              }
              flush_pending(strm);
              uVar16 = s->pending;
              uVar13 = (ulong)uVar16;
              if (s->pending_buf_size == uVar13) {
                bVar8 = false;
                goto LAB_00528458;
              }
              pgVar12 = s->gzhead;
            }
            pBVar5 = pgVar12->comment;
            uVar18 = s->gzindex;
            s->gzindex = uVar18 + 1;
            BVar9 = pBVar5[uVar18];
            s->pending = (int)uVar13 + 1;
            s->pending_buf[uVar13] = BVar9;
          } while (BVar9 != '\0');
          bVar8 = true;
          uVar13 = (ulong)uVar16;
LAB_00528458:
          if ((s->gzhead->hcrc != 0) &&
             (uVar18 = s->pending - (uint)uVar13, (uint)uVar13 <= s->pending && uVar18 != 0)) {
            uVar11 = cm_zlib_crc32(strm->adler,s->pending_buf + uVar13,uVar18);
            strm->adler = uVar11;
          }
          if (!bVar8) {
            iVar15 = s->status;
            goto LAB_0052848f;
          }
        }
        s->status = 0x67;
LAB_00528494:
        if (s->gzhead->hcrc != 0) {
          uVar16 = s->pending;
          uVar17 = (ulong)(uVar16 + 2);
          uVar13 = s->pending_buf_size;
          if (uVar13 < uVar17) {
            flush_pending(strm);
            uVar16 = s->pending;
            uVar13 = s->pending_buf_size;
            uVar17 = (ulong)(uVar16 + 2);
          }
          if (uVar13 < uVar17) goto LAB_00528501;
          uVar11 = strm->adler;
          s->pending = uVar16 + 1;
          s->pending_buf[uVar16] = (Bytef)uVar11;
          BVar9 = *(Bytef *)((long)&strm->adler + 1);
          uVar18 = s->pending;
          s->pending = uVar18 + 1;
          s->pending_buf[uVar18] = BVar9;
          uVar11 = cm_zlib_crc32(0,(uchar *)0x0,0);
          strm->adler = uVar11;
        }
        goto LAB_005284fa;
      }
LAB_0052830a:
      if (iVar15 == 0x49) {
        pgVar12 = s->gzhead;
        goto LAB_00528317;
      }
LAB_005283d0:
      if (iVar15 == 0x5b) goto LAB_005283d9;
LAB_0052848f:
      if (iVar15 == 0x67) goto LAB_00528494;
    }
LAB_00528501:
    if (s->pending == 0) {
      if (((strm->avail_in == 0) && (flush != 4)) && (flush <= iVar2)) goto LAB_0052853f;
LAB_0052851a:
      if (s->status == 0x29a) {
        if (strm->avail_in != 0) goto LAB_0052853f;
LAB_0052855c:
        if (s->lookahead != 0) goto LAB_00528565;
        if (flush != 0) {
          if (s->status != 0x29a) goto LAB_00528565;
          goto LAB_00528612;
        }
      }
      else {
        if (strm->avail_in == 0) goto LAB_0052855c;
LAB_00528565:
        bVar10 = (*configuration_table[s->level].func)(s,flush);
        if ((bVar10 & ~block_done) == finish_started) {
          s->status = 0x29a;
        }
        if ((bVar10 & ~finish_started) == need_more) {
          if (strm->avail_out != 0) {
            return 0;
          }
          s->last_flush = -1;
          return 0;
        }
        if (bVar10 == block_done) {
          if (flush == 1) {
            cm_zlib__tr_align(s);
          }
          else {
            cm_zlib__tr_stored_block(s,(charf *)0x0,0,0);
            if (flush == 3) {
              __s = s->head;
              uVar13 = (ulong)(s->hash_size - 1);
              __s[uVar13] = 0;
              memset(__s,0,uVar13 * 2);
            }
          }
          flush_pending(strm);
          if (strm->avail_out == 0) goto LAB_005286c5;
        }
LAB_00528612:
        if (flush == 4) {
          if (0 < s->wrap) {
            uVar11 = strm->adler;
            if (s->wrap == 2) {
              uVar18 = s->pending;
              s->pending = uVar18 + 1;
              s->pending_buf[uVar18] = (Bytef)uVar11;
              BVar9 = *(Bytef *)((long)&strm->adler + 1);
              uVar18 = s->pending;
              s->pending = uVar18 + 1;
              s->pending_buf[uVar18] = BVar9;
              BVar9 = *(Bytef *)((long)&strm->adler + 2);
              uVar18 = s->pending;
              s->pending = uVar18 + 1;
              s->pending_buf[uVar18] = BVar9;
              BVar9 = *(Bytef *)((long)&strm->adler + 3);
              uVar18 = s->pending;
              s->pending = uVar18 + 1;
              s->pending_buf[uVar18] = BVar9;
              uVar11 = strm->total_in;
              uVar18 = s->pending;
              s->pending = uVar18 + 1;
              s->pending_buf[uVar18] = (Bytef)uVar11;
              BVar9 = *(Bytef *)((long)&strm->total_in + 1);
              uVar18 = s->pending;
              s->pending = uVar18 + 1;
              s->pending_buf[uVar18] = BVar9;
              BVar9 = *(Bytef *)((long)&strm->total_in + 2);
              uVar18 = s->pending;
              s->pending = uVar18 + 1;
              s->pending_buf[uVar18] = BVar9;
              uVar13 = strm->total_in >> 0x18;
            }
            else {
              uVar18 = s->pending;
              s->pending = uVar18 + 1;
              s->pending_buf[uVar18] = (Bytef)(uVar11 >> 0x18);
              uVar18 = s->pending;
              s->pending = uVar18 + 1;
              s->pending_buf[uVar18] = (Bytef)(uVar11 >> 0x10);
              uVar13 = strm->adler;
              uVar18 = s->pending;
              s->pending = uVar18 + 1;
              s->pending_buf[uVar18] = (Bytef)(uVar13 >> 8);
            }
            uVar18 = s->pending;
            s->pending = uVar18 + 1;
            s->pending_buf[uVar18] = (Bytef)uVar13;
            flush_pending(strm);
            if (0 < s->wrap) {
              s->wrap = -s->wrap;
            }
            return (uint)(s->pending == 0);
          }
          return 1;
        }
      }
    }
    else {
      flush_pending(strm);
      if (strm->avail_out != 0) goto LAB_0052851a;
LAB_005286c5:
      s->last_flush = -1;
    }
    iVar15 = 0;
  }
  return iVar15;
}

Assistant:

int ZEXPORT deflate (strm, flush)
    z_streamp strm;
    int flush;
{
    int old_flush; /* value of flush param for previous deflate call */
    deflate_state *s;

    if (strm == Z_NULL || strm->state == Z_NULL ||
        flush > Z_FINISH || flush < 0) {
        return Z_STREAM_ERROR;
    }
    s = strm->state;

    if (strm->next_out == Z_NULL ||
        (strm->next_in == Z_NULL && strm->avail_in != 0) ||
        (s->status == FINISH_STATE && flush != Z_FINISH)) {
        ERR_RETURN(strm, Z_STREAM_ERROR);
    }
    if (strm->avail_out == 0) ERR_RETURN(strm, Z_BUF_ERROR);

    s->strm = strm; /* just in case */
    old_flush = s->last_flush;
    s->last_flush = flush;

    /* Write the header */
    if (s->status == INIT_STATE) {
#ifdef GZIP
        if (s->wrap == 2) {
            strm->adler = crc32(0L, Z_NULL, 0);
            put_byte(s, 31);
            put_byte(s, 139);
            put_byte(s, 8);
            if (s->gzhead == NULL) {
                put_byte(s, 0);
                put_byte(s, 0);
                put_byte(s, 0);
                put_byte(s, 0);
                put_byte(s, 0);
                put_byte(s, s->level == 9 ? 2 :
                            (s->strategy >= Z_HUFFMAN_ONLY || s->level < 2 ?
                             4 : 0));
                put_byte(s, OS_CODE);
                s->status = BUSY_STATE;
            }
            else {
                put_byte(s, (s->gzhead->text ? 1 : 0) +
                            (s->gzhead->hcrc ? 2 : 0) +
                            (s->gzhead->extra == Z_NULL ? 0 : 4) +
                            (s->gzhead->name == Z_NULL ? 0 : 8) +
                            (s->gzhead->comment == Z_NULL ? 0 : 16)
                        );
                put_byte(s, (Byte)(s->gzhead->time & 0xff));
                put_byte(s, (Byte)((s->gzhead->time >> 8) & 0xff));
                put_byte(s, (Byte)((s->gzhead->time >> 16) & 0xff));
                put_byte(s, (Byte)((s->gzhead->time >> 24) & 0xff));
                put_byte(s, s->level == 9 ? 2 :
                            (s->strategy >= Z_HUFFMAN_ONLY || s->level < 2 ?
                             4 : 0));
                put_byte(s, s->gzhead->os & 0xff);
                if (s->gzhead->extra != NULL) {
                    put_byte(s, s->gzhead->extra_len & 0xff);
                    put_byte(s, (s->gzhead->extra_len >> 8) & 0xff);
                }
                if (s->gzhead->hcrc)
                    strm->adler = crc32(strm->adler, s->pending_buf,
                                        s->pending);
                s->gzindex = 0;
                s->status = EXTRA_STATE;
            }
        }
        else
#endif
        {
            uInt header = (Z_DEFLATED + ((s->w_bits-8)<<4)) << 8;
            uInt level_flags;

            if (s->strategy >= Z_HUFFMAN_ONLY || s->level < 2)
                level_flags = 0;
            else if (s->level < 6)
                level_flags = 1;
            else if (s->level == 6)
                level_flags = 2;
            else
                level_flags = 3;
            header |= (level_flags << 6);
            if (s->strstart != 0) header |= PRESET_DICT;
            header += 31 - (header % 31);

            s->status = BUSY_STATE;
            putShortMSB(s, header);

            /* Save the adler32 of the preset dictionary: */
            if (s->strstart != 0) {
                putShortMSB(s, (uInt)(strm->adler >> 16));
                putShortMSB(s, (uInt)(strm->adler & 0xffff));
            }
            strm->adler = adler32(0L, Z_NULL, 0);
        }
    }
#ifdef GZIP
    if (s->status == EXTRA_STATE) {
        if (s->gzhead->extra != NULL) {
            uInt beg = s->pending;  /* start of bytes to update crc */

            while (s->gzindex < (s->gzhead->extra_len & 0xffff)) {
                if (s->pending == s->pending_buf_size) {
                    if (s->gzhead->hcrc && s->pending > beg)
                        strm->adler = crc32(strm->adler, s->pending_buf + beg,
                                            s->pending - beg);
                    flush_pending(strm);
                    beg = s->pending;
                    if (s->pending == s->pending_buf_size)
                        break;
                }
                put_byte(s, s->gzhead->extra[s->gzindex]);
                s->gzindex++;
            }
            if (s->gzhead->hcrc && s->pending > beg)
                strm->adler = crc32(strm->adler, s->pending_buf + beg,
                                    s->pending - beg);
            if (s->gzindex == s->gzhead->extra_len) {
                s->gzindex = 0;
                s->status = NAME_STATE;
            }
        }
        else
            s->status = NAME_STATE;
    }
    if (s->status == NAME_STATE) {
        if (s->gzhead->name != NULL) {
            uInt beg = s->pending;  /* start of bytes to update crc */
            int val;

            do {
                if (s->pending == s->pending_buf_size) {
                    if (s->gzhead->hcrc && s->pending > beg)
                        strm->adler = crc32(strm->adler, s->pending_buf + beg,
                                            s->pending - beg);
                    flush_pending(strm);
                    beg = s->pending;
                    if (s->pending == s->pending_buf_size) {
                        val = 1;
                        break;
                    }
                }
                val = s->gzhead->name[s->gzindex++];
                put_byte(s, val);
            } while (val != 0);
            if (s->gzhead->hcrc && s->pending > beg)
                strm->adler = crc32(strm->adler, s->pending_buf + beg,
                                    s->pending - beg);
            if (val == 0) {
                s->gzindex = 0;
                s->status = COMMENT_STATE;
            }
        }
        else
            s->status = COMMENT_STATE;
    }
    if (s->status == COMMENT_STATE) {
        if (s->gzhead->comment != NULL) {
            uInt beg = s->pending;  /* start of bytes to update crc */
            int val;

            do {
                if (s->pending == s->pending_buf_size) {
                    if (s->gzhead->hcrc && s->pending > beg)
                        strm->adler = crc32(strm->adler, s->pending_buf + beg,
                                            s->pending - beg);
                    flush_pending(strm);
                    beg = s->pending;
                    if (s->pending == s->pending_buf_size) {
                        val = 1;
                        break;
                    }
                }
                val = s->gzhead->comment[s->gzindex++];
                put_byte(s, val);
            } while (val != 0);
            if (s->gzhead->hcrc && s->pending > beg)
                strm->adler = crc32(strm->adler, s->pending_buf + beg,
                                    s->pending - beg);
            if (val == 0)
                s->status = HCRC_STATE;
        }
        else
            s->status = HCRC_STATE;
    }
    if (s->status == HCRC_STATE) {
        if (s->gzhead->hcrc) {
            if (s->pending + 2 > s->pending_buf_size)
                flush_pending(strm);
            if (s->pending + 2 <= s->pending_buf_size) {
                put_byte(s, (Byte)(strm->adler & 0xff));
                put_byte(s, (Byte)((strm->adler >> 8) & 0xff));
                strm->adler = crc32(0L, Z_NULL, 0);
                s->status = BUSY_STATE;
            }
        }
        else
            s->status = BUSY_STATE;
    }
#endif

    /* Flush as much pending output as possible */
    if (s->pending != 0) {
        flush_pending(strm);
        if (strm->avail_out == 0) {
            /* Since avail_out is 0, deflate will be called again with
             * more output space, but possibly with both pending and
             * avail_in equal to zero. There won't be anything to do,
             * but this is not an error situation so make sure we
             * return OK instead of BUF_ERROR at next call of deflate:
             */
            s->last_flush = -1;
            return Z_OK;
        }

    /* Make sure there is something to do and avoid duplicate consecutive
     * flushes. For repeated and useless calls with Z_FINISH, we keep
     * returning Z_STREAM_END instead of Z_BUF_ERROR.
     */
    } else if (strm->avail_in == 0 && flush <= old_flush &&
               flush != Z_FINISH) {
        ERR_RETURN(strm, Z_BUF_ERROR);
    }

    /* User must not provide more input after the first FINISH: */
    if (s->status == FINISH_STATE && strm->avail_in != 0) {
        ERR_RETURN(strm, Z_BUF_ERROR);
    }

    /* Start a new block or continue the current one.
     */
    if (strm->avail_in != 0 || s->lookahead != 0 ||
        (flush != Z_NO_FLUSH && s->status != FINISH_STATE)) {
        block_state bstate;

        bstate = (*(configuration_table[s->level].func))(s, flush);

        if (bstate == finish_started || bstate == finish_done) {
            s->status = FINISH_STATE;
        }
        if (bstate == need_more || bstate == finish_started) {
            if (strm->avail_out == 0) {
                s->last_flush = -1; /* avoid BUF_ERROR next call, see above */
            }
            return Z_OK;
            /* If flush != Z_NO_FLUSH && avail_out == 0, the next call
             * of deflate should use the same flush parameter to make sure
             * that the flush is complete. So we don't have to output an
             * empty block here, this will be done at next call. This also
             * ensures that for a very small output buffer, we emit at most
             * one empty block.
             */
        }
        if (bstate == block_done) {
            if (flush == Z_PARTIAL_FLUSH) {
                _tr_align(s);
            } else { /* FULL_FLUSH or SYNC_FLUSH */
                _tr_stored_block(s, (char*)0, 0L, 0);
                /* For a full flush, this empty block will be recognized
                 * as a special marker by inflate_sync().
                 */
                if (flush == Z_FULL_FLUSH) {
                    CLEAR_HASH(s);             /* forget history */
                }
            }
            flush_pending(strm);
            if (strm->avail_out == 0) {
              s->last_flush = -1; /* avoid BUF_ERROR at next call, see above */
              return Z_OK;
            }
        }
    }
    Assert(strm->avail_out > 0, "bug2");

    if (flush != Z_FINISH) return Z_OK;
    if (s->wrap <= 0) return Z_STREAM_END;

    /* Write the trailer */
#ifdef GZIP
    if (s->wrap == 2) {
        put_byte(s, (Byte)(strm->adler & 0xff));
        put_byte(s, (Byte)((strm->adler >> 8) & 0xff));
        put_byte(s, (Byte)((strm->adler >> 16) & 0xff));
        put_byte(s, (Byte)((strm->adler >> 24) & 0xff));
        put_byte(s, (Byte)(strm->total_in & 0xff));
        put_byte(s, (Byte)((strm->total_in >> 8) & 0xff));
        put_byte(s, (Byte)((strm->total_in >> 16) & 0xff));
        put_byte(s, (Byte)((strm->total_in >> 24) & 0xff));
    }
    else
#endif
    {
        putShortMSB(s, (uInt)(strm->adler >> 16));
        putShortMSB(s, (uInt)(strm->adler & 0xffff));
    }
    flush_pending(strm);
    /* If avail_out is zero, the application will call deflate again
     * to flush the rest.
     */
    if (s->wrap > 0) s->wrap = -s->wrap; /* write the trailer only once! */
    return s->pending != 0 ? Z_OK : Z_STREAM_END;
}